

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O0

Position * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::computeCenterOfPressureFromLoadCellMeasurements
          (ThreeAxisForceTorqueContactSensor *this,VectorDynSize *loadCellMeasurements)

{
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *this_00;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *pMVar1;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *pMVar2;
  double *pdVar3;
  VectorDynSize *in_RDX;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_RSI;
  Position *in_RDI;
  size_t i;
  Vector3 weightedSumOfLocations;
  double sumOfMeasurementsInN;
  Position *ret;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffef8;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *this_01;
  StorageBaseType *in_stack_ffffffffffffff40;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff48;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *local_40;
  VectorFixSize<3U> local_38;
  double local_20;
  VectorDynSize *local_18;
  
  local_18 = in_RDX;
  this_00 = (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)iDynTree::VectorDynSize::size();
  pMVar1 = (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *
           )std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::size
                      ((vector<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
                       ((long)*(double *)(in_RSI + 8) + 0xa8));
  if (this_00 == pMVar1) {
    local_20 = 0.0;
    VectorFixSize<3U>::VectorFixSize(&local_38);
    VectorFixSize<3U>::zero(&local_38);
    local_40 = (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)0x0;
    while( true ) {
      this_01 = local_40;
      pMVar2 = (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
               iDynTree::VectorDynSize::size();
      if (pMVar2 <= this_01) break;
      pdVar3 = (double *)iDynTree::VectorDynSize::operator()(local_18,(ulong)local_40);
      local_20 = *pdVar3 + local_20;
      in_stack_fffffffffffffef8 =
           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
            *)iDynTree::VectorDynSize::operator()(local_18,(ulong)local_40);
      std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::operator[]
                ((vector<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
                 ((long)*(double *)(in_RSI + 8) + 0xa8),(size_type)local_40);
      toEigen<3U>((VectorFixSize<3U> *)in_RSI);
      Eigen::operator*((double *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      toEigen<3U>((VectorFixSize<3U> *)in_RSI);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
      operator+=(this_00,in_RSI);
      local_40 = (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 &local_40->field_0x1;
    }
    if (1e-09 <= local_20) {
      iDynTree::Position::Position(in_RDI);
      toEigen<3U>((VectorFixSize<3U> *)in_RSI);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator/
                (in_stack_ffffffffffffff48,(double *)in_stack_ffffffffffffff40);
      toEigen<3U>((VectorFixSize<3U> *)in_RSI);
      Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                (this_01,in_stack_fffffffffffffef8);
    }
    else {
      iDynTree::reportError
                ("ThreeAxisForceTorqueContactSensor",
                 "computeThreeAxisForceTorqueFromLoadCellMeasurements",
                 "loadCellMeasurements sum is less than 1e-9");
      iDynTree::Position::Position(in_RDI);
      VectorFixSize<3U>::zero((VectorFixSize<3U> *)in_RDI);
    }
  }
  else {
    iDynTree::reportError
              ("ThreeAxisForceTorqueContactSensor",
               "computeThreeAxisForceTorqueFromLoadCellMeasurements",
               "loadCellMeasurements has the wrong size");
    iDynTree::Position::Position(in_RDI);
    VectorFixSize<3U>::zero((VectorFixSize<3U> *)in_RDI);
  }
  return in_RDI;
}

Assistant:

Position ThreeAxisForceTorqueContactSensor::computeCenterOfPressureFromLoadCellMeasurements(VectorDynSize& loadCellMeasurements) const
{
    if (loadCellMeasurements.size() != pimpl->m_loadCellLocations.size())
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements has the wrong size");
        Position zeroVec; zeroVec.zero();
        return zeroVec;
    }

    // We assume that the location of the load cells is on the XY plane. In this case, the cop is just the average of the locations weighted on the measurements
    double sumOfMeasurementsInN=0.0;
    Vector3 weightedSumOfLocations; weightedSumOfLocations.zero();
    for (size_t i=0; i < loadCellMeasurements.size(); i++)
    {
        sumOfMeasurementsInN += loadCellMeasurements(i);
        toEigen(weightedSumOfLocations) += loadCellMeasurements(i)*toEigen(pimpl->m_loadCellLocations[i]);
    }

    if (sumOfMeasurementsInN < 1e-9)
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements sum is less than 1e-9");
        Position zeroVec; zeroVec.zero();
        return zeroVec;
    }

    Position ret;
    toEigen(ret) = toEigen(weightedSumOfLocations)/sumOfMeasurementsInN;
    return ret;
}